

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O1

void __thiscall
TTD::ThreadContextTTD::NotifyCtxDestroyInRecord(ThreadContextTTD *this,ScriptContext *ctx)

{
  Type ppSVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  ScriptContext *local_10;
  ScriptContext *ctx_local;
  
  uVar3 = (ulong)(this->m_contextList).
                 super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.
                 count;
  bVar5 = 0 < (long)uVar3;
  if (0 < (long)uVar3) {
    ppSVar1 = (this->m_contextList).
              super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.buffer
    ;
    if (*ppSVar1 == ctx) goto LAB_00903db9;
    uVar2 = 1;
    do {
      uVar4 = uVar2;
      if (uVar3 == uVar4) break;
      uVar2 = uVar4 + 1;
    } while (ppSVar1[uVar4] != ctx);
    bVar5 = uVar4 < uVar3;
  }
  if (!bVar5) {
    return;
  }
LAB_00903db9:
  local_10 = ctx;
  Js::
  CopyRemovePolicy<JsUtil::List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  ::Remove((CopyRemovePolicy<JsUtil::List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
            *)&(this->m_contextList).field_0x28,&this->m_contextList,&local_10);
  return;
}

Assistant:

void ThreadContextTTD::NotifyCtxDestroyInRecord(Js::ScriptContext* ctx)
    {
        if(this->m_contextList.Contains(ctx))
        {
            this->m_contextList.Remove(ctx);
        }
    }